

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMateXdistance::ArchiveIN(ChLinkMateXdistance *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChLinkMateXdistance>(marchive);
  ChLinkMateGeneric::ArchiveIN(&this->super_ChLinkMateGeneric,marchive);
  (**(code **)(*(long *)marchive + 0x20))(marchive);
  return;
}

Assistant:

void ChLinkMateXdistance::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMateXdistance>();

    // deserialize parent class
    ChLinkMateGeneric::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(distance);
}